

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall btRaycastVehicle::updateSuspension(btRaycastVehicle *this,btScalar deltaTime)

{
  int iVar1;
  btWheelInfo *this_00;
  long in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  btScalar susp_damping;
  btScalar projected_rel_vel;
  btScalar length_diff;
  btScalar current_length;
  btScalar susp_length;
  btScalar force;
  btWheelInfo *wheel_info;
  int w_it;
  btScalar chassisMass;
  float local_38;
  int local_14;
  
  bVar2 = btRigidBody::getInvMass(*(btRigidBody **)(in_RDI + 0xa8));
  for (local_14 = 0; iVar1 = getNumWheels((btRaycastVehicle *)0x234ca4), local_14 < iVar1;
      local_14 = local_14 + 1) {
    this_00 = btAlignedObjectArray<btWheelInfo>::operator[]
                        ((btAlignedObjectArray<btWheelInfo> *)(in_RDI + 0xc0),local_14);
    if (((this_00->m_raycastInfo).m_isInContact & 1U) == 0) {
      this_00->m_wheelsSuspensionForce = 0.0;
    }
    else {
      bVar3 = btWheelInfo::getSuspensionRestLength(this_00);
      if (0.0 <= this_00->m_suspensionRelativeVelocity) {
        local_38 = this_00->m_wheelsDampingRelaxation;
      }
      else {
        local_38 = this_00->m_wheelsDampingCompression;
      }
      this_00->m_wheelsSuspensionForce =
           (-local_38 * this_00->m_suspensionRelativeVelocity +
           this_00->m_suspensionStiffness * (bVar3 - (this_00->m_raycastInfo).m_suspensionLength) *
           this_00->m_clippedInvContactDotSuspension) * (1.0 / bVar2);
      if (this_00->m_wheelsSuspensionForce <= 0.0 && this_00->m_wheelsSuspensionForce != 0.0) {
        this_00->m_wheelsSuspensionForce = 0.0;
      }
    }
  }
  return;
}

Assistant:

void	btRaycastVehicle::updateSuspension(btScalar deltaTime)
{
	(void)deltaTime;

	btScalar chassisMass = btScalar(1.) / m_chassisBody->getInvMass();
	
	for (int w_it=0; w_it<getNumWheels(); w_it++)
	{
		btWheelInfo &wheel_info = m_wheelInfo[w_it];
		
		if ( wheel_info.m_raycastInfo.m_isInContact )
		{
			btScalar force;
			//	Spring
			{
				btScalar	susp_length			= wheel_info.getSuspensionRestLength();
				btScalar	current_length = wheel_info.m_raycastInfo.m_suspensionLength;

				btScalar length_diff = (susp_length - current_length);

				force = wheel_info.m_suspensionStiffness
					* length_diff * wheel_info.m_clippedInvContactDotSuspension;
			}
		
			// Damper
			{
				btScalar projected_rel_vel = wheel_info.m_suspensionRelativeVelocity;
				{
					btScalar	susp_damping;
					if ( projected_rel_vel < btScalar(0.0) )
					{
						susp_damping = wheel_info.m_wheelsDampingCompression;
					}
					else
					{
						susp_damping = wheel_info.m_wheelsDampingRelaxation;
					}
					force -= susp_damping * projected_rel_vel;
				}
			}

			// RESULT
			wheel_info.m_wheelsSuspensionForce = force * chassisMass;
			if (wheel_info.m_wheelsSuspensionForce < btScalar(0.))
			{
				wheel_info.m_wheelsSuspensionForce = btScalar(0.);
			}
		}
		else
		{
			wheel_info.m_wheelsSuspensionForce = btScalar(0.0);
		}
	}

}